

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  anon_struct_64_8_77d55576 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 8;
  local_20 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_98 = sysbvm_context_shallowCopy(context,*arguments);
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_98 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x18) = sVar3;
  sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_98 + 0x28),(context->roots).symbolType,
                         arguments[1]);
  *(sysbvm_tuple_t *)(local_98 + 0x28) = sStack_90;
  if (*(long *)(local_98 + 0x48) == 0x1f) {
    sysbvm_environment_setNewMacroValueBinding
              (context,arguments[1],*(sysbvm_tuple_t *)(local_98 + 0x10),sStack_70,
               *(sysbvm_tuple_t *)(local_98 + 0x38));
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar3 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_98 + 0x10),0x2f);
    return sVar3;
  }
  if (*(sysbvm_tuple_t *)(local_98 + 0x30) != 0) {
    local_88 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_98 + 0x30),(context->roots).typeType,
                          arguments[1]);
    _Var2 = sysbvm_astNode_isLiteralNode(context,local_88);
    if (_Var2) {
      local_68 = sysbvm_astLiteralNode_getValue(local_88);
    }
  }
  sStack_80 = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                        (context,*(sysbvm_tuple_t *)(local_98 + 0x38),local_88,arguments[1],
                         *(sysbvm_tuple_t *)(local_98 + 0x10),&local_68);
  *(sysbvm_tuple_t *)(local_98 + 0x38) = sStack_80;
  sVar3 = local_68;
  if (local_68 == 0) {
    if (*(long *)(local_98 + 0x30) == 0) {
      if ((sStack_80 & 0xf) == 0 && sStack_80 != 0) {
        sVar3 = *(sysbvm_tuple_t *)(sStack_80 + 0x20);
        local_68 = sVar3;
      }
      else {
        sVar3 = 0;
        local_68 = sVar3;
      }
    }
    else {
      sVar3 = 0;
    }
  }
  *(sysbvm_tuple_t *)(local_98 + 0x70) = sVar3;
  lVar1 = *(long *)(local_98 + 0x50);
  if (lVar1 == 0x1f) {
    sVar3 = sysbvm_type_createMemberReferenceType(context,sVar3);
    local_68 = sVar3;
  }
  *(undefined8 *)(local_98 + 0x30) = 0;
  *(sysbvm_tuple_t *)(local_98 + 0x20) = sVar3;
  if (sStack_90 == 0) {
    if (sStack_80 == 0) {
      sStack_80 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_98 + 0x10),0);
    }
  }
  else {
    _Var2 = sysbvm_astNode_isLiteralNode(context,sStack_90);
    if (!_Var2) {
      sysbvm_error("Local definition analyzed name must be a literal node.");
    }
    sStack_70 = sysbvm_astLiteralNode_getValue(sStack_90);
    if (lVar1 == 0x1f) {
LAB_00127eb4:
      local_78 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                           (context,arguments[1],*(sysbvm_tuple_t *)(local_98 + 0x10),sStack_70,
                            local_68);
      *(sysbvm_tuple_t *)(local_98 + 0x40) = local_78;
      sysbvm_stackFrame_popRecord(&local_50);
      sysbvm_stackFrame_popRecord(&local_38);
      return local_98;
    }
    if (sStack_80 != 0) {
      _Var2 = sysbvm_astNode_isLiteralNode(context,sStack_80);
      if (!_Var2) goto LAB_00127eb4;
      if (sStack_80 != 0) {
        sStack_60 = sysbvm_astLiteralNode_getValue(sStack_80);
      }
    }
    sStack_80 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_98 + 0x10),sStack_60)
    ;
    local_78 = sysbvm_analysisEnvironment_setNewValueBinding
                         (context,arguments[1],*(sysbvm_tuple_t *)(local_98 + 0x10),sStack_70,
                          sStack_60);
    *(sysbvm_tuple_t *)(local_98 + 0x40) = local_78;
  }
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_80;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astVariableDefinitionNode_t *variableDefinitionNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTypeExpression;
        sysbvm_tuple_t analyzedValueExpression;
        
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t type;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t*)sysbvm_context_shallowCopy(context, *node);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.variableDefinitionNode->super.sourcePosition);
    gcFrame.variableDefinitionNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->nameExpression, context->roots.symbolType, *environment);
    gcFrame.variableDefinitionNode->nameExpression = gcFrame.analyzedNameExpression;

    if(sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMacroSymbol))
    {
        sysbvm_environment_setNewMacroValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.variableDefinitionNode->valueExpression);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
    }

    if(gcFrame.variableDefinitionNode->typeExpression)
    {
        gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->typeExpression, context->roots.typeType, *environment);

        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
            gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);
    }

    gcFrame.analyzedValueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(context, gcFrame.variableDefinitionNode->valueExpression, gcFrame.analyzedTypeExpression, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, &gcFrame.type);
    gcFrame.variableDefinitionNode->valueExpression = gcFrame.analyzedValueExpression;

    // Fallback to the type of the analyzed value.
    if(!gcFrame.type && !gcFrame.variableDefinitionNode->typeExpression)
        gcFrame.type = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedValueExpression);
    gcFrame.variableDefinitionNode->analyzedValueType = gcFrame.type;

    bool isMutable = sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMutable);
    if(isMutable)
        gcFrame.type = sysbvm_type_createMemberReferenceType(context, gcFrame.type);

    gcFrame.variableDefinitionNode->typeExpression = SYSBVM_NULL_TUPLE;
    gcFrame.variableDefinitionNode->super.analyzedType = gcFrame.type;
    if(!gcFrame.analyzedNameExpression)
    {
        if(!gcFrame.analyzedValueExpression)
            gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_NULL_TUPLE);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }

    if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
        sysbvm_error("Local definition analyzed name must be a literal node.");

    gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    if(!isMutable &&
        (!gcFrame.analyzedValueExpression || sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedValueExpression)))
    {
        if(gcFrame.analyzedValueExpression)
            gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedValueExpression);
        gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.value);
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.value);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;

        // Replace the node by its literal value.
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }
    else
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.type);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.variableDefinitionNode;
}